

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int count;
  long lVar2;
  unique_ptr<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_> this;
  long lVar3;
  ostream *poVar4;
  allocator<char> local_51;
  string local_50 [32];
  
  count = 0;
  lVar2 = 0;
  while( true ) {
    while (iVar1 = getopt(argc,argv,"+p:+c:"), iVar1 == 0x70) {
      lVar2 = atol(optarg);
    }
    if (iVar1 == -1) break;
    if (iVar1 != 99) {
      poVar4 = std::operator<<((ostream *)&std::cout,"usage: ");
      poVar4 = std::operator<<(poVar4,*argv);
      poVar4 = std::operator<<(poVar4," -p port -c count");
      std::endl<char,std::char_traits<char>>(poVar4);
      return 1;
    }
    count = atoi(optarg);
  }
  this._M_t.super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>.
  _M_t.super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>.
  super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl =
       (__uniq_ptr_data<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>,_true,_true>)
       operator_new(1000);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"../spec/FIX42.xml",&local_51);
  FIX::DataDictionary::DataDictionary
            ((DataDictionary *)
             this._M_t.
             super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>.
             _M_t.
             super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>
             .super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl,local_50,false);
  if ((__uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>)
      s_dataDictionary._M_t.
      super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>._M_t.
      super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>.
      super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>)0x0) {
    lVar3 = *(long *)s_dataDictionary._M_t.
                     super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>
                     .super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl;
    s_dataDictionary._M_t.
    super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>._M_t.
    super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>.
    super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl =
         this._M_t.
         super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>._M_t.
         super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>.
         super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl;
    (**(code **)(lVar3 + 8))();
    this._M_t.super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>.
    _M_t.super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>.
    super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl =
         s_dataDictionary._M_t.
         super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>._M_t.
         super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>.
         super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl;
  }
  s_dataDictionary._M_t.
  super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>._M_t.
  super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>.
  super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl =
       this._M_t.
       super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>._M_t.
       super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>.
       super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl;
  std::__cxx11::string::~string(local_50);
  std::operator<<((ostream *)&std::cout,"Converting integers to strings: ");
  lVar3 = testIntegerToString(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Converting strings to integers: ");
  lVar3 = testStringToInteger(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Converting doubles to strings: ");
  lVar3 = testDoubleToString(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Converting strings to doubles: ");
  lVar3 = testStringToDouble(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Creating Heartbeat messages: ");
  lVar3 = testCreateHeartbeat(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Identifying message types: ");
  lVar3 = testIdentifyType(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Serializing Heartbeat messages to strings: ");
  lVar3 = testSerializeToStringHeartbeat(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Serializing Heartbeat messages from strings: ");
  lVar3 = testSerializeFromStringHeartbeat(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,
                  "Serializing Heartbeat messages from strings and validation: ");
  lVar3 = testSerializeFromStringAndValidateHeartbeat(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Creating NewOrderSingle messages: ");
  lVar3 = testCreateNewOrderSingle(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Serializing NewOrderSingle messages to strings: ");
  lVar3 = testSerializeToStringNewOrderSingle(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Serializing NewOrderSingle messages from strings: ");
  lVar3 = testSerializeFromStringNewOrderSingle(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,
                  "Serializing NewOrderSingle messages from strings and validation: ");
  lVar3 = testSerializeFromStringAndValidateNewOrderSingle(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Creating QuoteRequest messages: ");
  lVar3 = testCreateQuoteRequest(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Serializing QuoteRequest messages to strings: ");
  lVar3 = testSerializeToStringQuoteRequest(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Serializing QuoteRequest messages from strings: ");
  lVar3 = testSerializeFromStringQuoteRequest(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,
                  "Serializing QuoteRequest messages from strings and validation: ");
  lVar3 = testSerializeFromStringAndValidateQuoteRequest(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Reading fields from QuoteRequest message: ");
  lVar3 = testReadFromQuoteRequest(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Storing NewOrderSingle messages: ");
  lVar3 = testFileStoreNewOrderSingle(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,
                  "Validating NewOrderSingle messages with no data dictionary: ");
  lVar3 = testValidateNewOrderSingle(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Validating NewOrderSingle messages with data dictionary: ")
  ;
  lVar3 = testValidateDictNewOrderSingle(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Validating QuoteRequest messages with no data dictionary: "
                 );
  lVar3 = testValidateQuoteRequest(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,"Validating QuoteRequest messages with data dictionary: ");
  lVar3 = testValidateDictQuoteRequest(count);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,
                  "Sending/Receiving NewOrderSingle/ExecutionReports on Socket");
  lVar3 = testSendOnSocket(count,(short)lVar2);
  report(lVar3,count);
  std::operator<<((ostream *)&std::cout,
                  "Sending/Receiving NewOrderSingle/ExecutionReports on ThreadedSocket");
  lVar2 = testSendOnThreadedSocket(count,(short)lVar2);
  report(lVar2,count);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  int count = 0;
  short port = 0;

  int opt;
  while ( (opt = getopt( argc, argv, "+p:+c:" )) != -1 )
  {
    switch( opt )
    {
    case 'p':
      port = (short)atol( optarg );
      break;
    case 'c':
      count = atoi( optarg );
      break;
    default:
      std::cout << "usage: "
      << argv[ 0 ]
      << " -p port -c count" << std::endl;
      return 1;
    }
  }

  s_dataDictionary.reset( new FIX::DataDictionary( "../spec/FIX42.xml" ) );

  std::cout << "Converting integers to strings: ";
  report( testIntegerToString( count ), count );

  std::cout << "Converting strings to integers: ";
  report( testStringToInteger( count ), count );

  std::cout << "Converting doubles to strings: ";
  report( testDoubleToString( count ), count );

  std::cout << "Converting strings to doubles: ";
  report( testStringToDouble( count ), count );

  std::cout << "Creating Heartbeat messages: ";
  report( testCreateHeartbeat( count ), count );

  std::cout << "Identifying message types: ";
  report( testIdentifyType( count ), count );

  std::cout << "Serializing Heartbeat messages to strings: ";
  report( testSerializeToStringHeartbeat( count ), count );

  std::cout << "Serializing Heartbeat messages from strings: ";
  report( testSerializeFromStringHeartbeat( count ), count );

  std::cout << "Serializing Heartbeat messages from strings and validation: ";
  report( testSerializeFromStringAndValidateHeartbeat( count ), count );

  std::cout << "Creating NewOrderSingle messages: ";
  report( testCreateNewOrderSingle( count ), count );

  std::cout << "Serializing NewOrderSingle messages to strings: ";
  report( testSerializeToStringNewOrderSingle( count ), count );

  std::cout << "Serializing NewOrderSingle messages from strings: ";
  report( testSerializeFromStringNewOrderSingle( count ), count );

  std::cout << "Serializing NewOrderSingle messages from strings and validation: ";
  report( testSerializeFromStringAndValidateNewOrderSingle( count ), count );

  std::cout << "Creating QuoteRequest messages: ";
  report( testCreateQuoteRequest( count ), count );

  std::cout << "Serializing QuoteRequest messages to strings: ";
  report( testSerializeToStringQuoteRequest( count ), count );

  std::cout << "Serializing QuoteRequest messages from strings: ";
  report( testSerializeFromStringQuoteRequest( count ), count );

  std::cout << "Serializing QuoteRequest messages from strings and validation: ";
  report( testSerializeFromStringAndValidateQuoteRequest( count ), count );

  std::cout << "Reading fields from QuoteRequest message: ";
  report( testReadFromQuoteRequest( count ), count );

  std::cout << "Storing NewOrderSingle messages: ";
  report( testFileStoreNewOrderSingle( count ), count );

  std::cout << "Validating NewOrderSingle messages with no data dictionary: ";
  report( testValidateNewOrderSingle( count ), count );

  std::cout << "Validating NewOrderSingle messages with data dictionary: ";
  report( testValidateDictNewOrderSingle( count ), count );

  std::cout << "Validating QuoteRequest messages with no data dictionary: ";
  report( testValidateQuoteRequest( count ), count );

  std::cout << "Validating QuoteRequest messages with data dictionary: ";
  report( testValidateDictQuoteRequest( count ), count );

  std::cout << "Sending/Receiving NewOrderSingle/ExecutionReports on Socket";
  report( testSendOnSocket( count, port ), count );

  std::cout << "Sending/Receiving NewOrderSingle/ExecutionReports on ThreadedSocket";
  report( testSendOnThreadedSocket( count, port ), count );

  return 0;
}